

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegisterAllocation.cpp
# Opt level: O2

void addFirstLineAllocation(AssemblyCommands *commands,RegisterInfo *registerInfo)

{
  const_iterator cVar1;
  CTemp local_78;
  value_type local_58 [2];
  _Alloc_hider local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  
  cVar1._M_current =
       (commands->
       super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string((string *)local_58,(string *)registerInfo);
  local_78.name.field_2._12_4_ = totalAllocated * 4;
  std::make_shared<AssemblyCode::SubRegConstCommand,IRT::CTemp,int>
            ((CTemp *)&local_38,(int *)local_58);
  local_78.name._M_dataplus._M_p = local_38._M_p;
  local_78.name._M_string_length = (size_type)_Stack_30._M_pi;
  local_38._M_p = (pointer)0x0;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
  ::_M_insert_rval(commands,cVar1,(value_type *)&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_78.name._M_string_length);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_30);
  std::__cxx11::string::~string((string *)local_58);
  cVar1._M_current =
       (commands->
       super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  std::make_shared<AssemblyCode::MoveRegRegCommand,IRT::CTemp&,IRT::CTemp&>
            (&local_78,&registerInfo->spBeginReg);
  local_58[0].super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_78.name._M_dataplus._M_p;
  local_58[0].super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.name._M_string_length
  ;
  local_78.name._M_dataplus._M_p = (pointer)0x0;
  local_78.name._M_string_length = 0;
  std::
  vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
  ::_M_insert_rval(commands,cVar1,local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58[0].
              super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_78.name._M_string_length);
  return;
}

Assistant:

void addFirstLineAllocation(AssemblyCommands& commands, AssemblyCode::RegisterInfo& registerInfo) {
    commands.insert(commands.begin(),
                    std::make_shared<AssemblyCode::SubRegConstCommand>(IRT::CTemp(registerInfo.espReg),
                    totalAllocated * IRT::CFrame::wordSize));

    commands.insert(commands.begin(),
                    std::make_shared<AssemblyCode::MoveRegRegCommand>(registerInfo.spBeginReg,
                                                    registerInfo.espReg));
}